

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_function.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateFunctionParameter(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  uint id;
  uint32_t uVar2;
  uint32_t uVar3;
  StorageClass SVar4;
  size_t sVar5;
  DiagnosticStream *pDVar6;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *pvVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  size_type sVar9;
  Instruction *pIVar10;
  uint32_t local_11cc;
  DiagnosticStream local_11c8;
  uint32_t local_fec;
  DiagnosticStream local_fe8;
  _Base_ptr local_e08;
  _Base_ptr local_e00;
  undefined1 local_df2;
  bool foundRestrict_1;
  iterator iStack_df0;
  _Base_ptr local_de8;
  byte local_dd9;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psStack_dd8;
  bool foundAliased_1;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *decorations_1;
  Instruction *pointee_type;
  uint pointee_type_id;
  uint32_t local_be4;
  DiagnosticStream local_be0;
  _Base_ptr local_a00;
  _Base_ptr local_9f8;
  undefined1 local_9ea;
  bool foundRestrict;
  iterator iStack_9e8;
  _Base_ptr local_9e0;
  byte local_9d1;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psStack_9d0;
  bool foundAliased;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *decorations;
  Instruction *param_nonarray_type;
  undefined1 local_9b8 [4];
  uint32_t param_nonarray_type_id;
  DiagnosticStream local_998;
  Instruction *local_7c0;
  Instruction *param_type;
  uint32_t local_7ac;
  DiagnosticStream local_7a8;
  DiagnosticStream local_5d0;
  Instruction *local_3f8;
  Instruction *function_type;
  undefined1 local_3e8 [4];
  uint function_type_id;
  const_reference local_210;
  value_type *func_inst;
  size_type local_30;
  size_t inst_num;
  size_t param_index;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  inst_num = 0;
  param_index = (size_t)inst;
  inst_local = (Instruction *)_;
  sVar5 = Instruction::LineNum(inst);
  local_30 = sVar5 - 1;
  if (local_30 == 0) {
    ValidationState_t::diag
              ((DiagnosticStream *)&func_inst,(ValidationState_t *)inst_local,
               SPV_ERROR_INVALID_LAYOUT,(Instruction *)param_index);
    pDVar6 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&func_inst,
                        (char (*) [52])"Function parameter cannot be the first instruction.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&func_inst);
  }
  else {
    pvVar7 = ValidationState_t::ordered_instructions((ValidationState_t *)inst_local);
    local_210 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                ::operator[](pvVar7,local_30);
    while (local_30 = local_30 - 1, local_30 != 0) {
      pvVar7 = ValidationState_t::ordered_instructions((ValidationState_t *)inst_local);
      local_210 = std::
                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                  operator[](pvVar7,local_30);
      OVar1 = Instruction::opcode(local_210);
      if (OVar1 == OpFunction) break;
      OVar1 = Instruction::opcode(local_210);
      if (OVar1 == OpFunctionParameter) {
        inst_num = inst_num + 1;
      }
    }
    OVar1 = Instruction::opcode(local_210);
    if (OVar1 == OpFunction) {
      function_type._4_4_ = Instruction::GetOperandAs<unsigned_int>(local_210,3);
      local_3f8 = ValidationState_t::FindDef((ValidationState_t *)inst_local,function_type._4_4_);
      sVar5 = inst_num;
      if (local_3f8 == (Instruction *)0x0) {
        ValidationState_t::diag
                  (&local_5d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_210);
        pDVar6 = DiagnosticStream::operator<<
                           (&local_5d0,(char (*) [34])"Missing function type definition.");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        DiagnosticStream::~DiagnosticStream(&local_5d0);
      }
      else {
        pvVar8 = Instruction::words(local_3f8);
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
        pIVar10 = inst_local;
        if (sVar5 < sVar9 - 3) {
          id = Instruction::GetOperandAs<unsigned_int>(local_3f8,inst_num + 2);
          local_7c0 = ValidationState_t::FindDef((ValidationState_t *)pIVar10,id);
          if (local_7c0 != (Instruction *)0x0) {
            uVar2 = Instruction::type_id((Instruction *)param_index);
            uVar3 = Instruction::id(local_7c0);
            if (uVar2 == uVar3) {
              param_nonarray_type._4_4_ = Instruction::id(local_7c0);
              while (OVar1 = ValidationState_t::GetIdOpcode
                                       ((ValidationState_t *)inst_local,param_nonarray_type._4_4_),
                    OVar1 == OpTypeArray) {
                pIVar10 = ValidationState_t::FindDef
                                    ((ValidationState_t *)inst_local,param_nonarray_type._4_4_);
                param_nonarray_type._4_4_ = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
              }
              OVar1 = ValidationState_t::GetIdOpcode
                                ((ValidationState_t *)inst_local,param_nonarray_type._4_4_);
              if ((OVar1 == OpTypePointer) ||
                 (OVar1 = ValidationState_t::GetIdOpcode
                                    ((ValidationState_t *)inst_local,param_nonarray_type._4_4_),
                 OVar1 == OpTypeUntypedPointerKHR)) {
                decorations = (set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                               *)ValidationState_t::FindDef
                                           ((ValidationState_t *)inst_local,
                                            param_nonarray_type._4_4_);
                SVar4 = Instruction::GetOperandAs<spv::StorageClass>((Instruction *)decorations,1);
                pIVar10 = inst_local;
                if (SVar4 == PhysicalStorageBuffer) {
                  uVar2 = Instruction::id((Instruction *)param_index);
                  psStack_9d0 = ValidationState_t::id_decorations
                                          ((ValidationState_t *)pIVar10,uVar2);
                  local_9e0 = (_Base_ptr)
                              std::
                              set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                              ::begin(psStack_9d0);
                  iStack_9e8 = std::
                               set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                               ::end(psStack_9d0);
                  local_9d1 = std::
                              any_of<std::_Rb_tree_const_iterator<spvtools::val::Decoration>,spvtools::val::(anonymous_namespace)::ValidateFunctionParameter(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0>
                                        (local_9e0,iStack_9e8._M_node);
                  local_9f8 = (_Base_ptr)
                              std::
                              set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                              ::begin(psStack_9d0);
                  local_a00 = (_Base_ptr)
                              std::
                              set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                              ::end(psStack_9d0);
                  local_9ea = std::
                              any_of<std::_Rb_tree_const_iterator<spvtools::val::Decoration>,spvtools::val::(anonymous_namespace)::ValidateFunctionParameter(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1>
                                        (local_9f8,local_a00);
                  if (((local_9d1 & 1) == 0) && (!(bool)local_9ea)) {
                    ValidationState_t::diag
                              (&local_be0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                               (Instruction *)param_index);
                    pDVar6 = DiagnosticStream::operator<<
                                       (&local_be0,(char (*) [21])"OpFunctionParameter ");
                    local_be4 = Instruction::id((Instruction *)param_index);
                    pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_be4);
                    pDVar6 = DiagnosticStream::operator<<
                                       (pDVar6,(char (*) [66])
                                               ": expected Aliased or Restrict for PhysicalStorageBuffer pointer."
                                       );
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                    DiagnosticStream::~DiagnosticStream(&local_be0);
                    return __local._4_4_;
                  }
                  if (((local_9d1 & 1) != 0) && ((bool)local_9ea)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&pointee_type_id,(ValidationState_t *)inst_local,
                               SPV_ERROR_INVALID_ID,(Instruction *)param_index);
                    pDVar6 = DiagnosticStream::operator<<
                                       ((DiagnosticStream *)&pointee_type_id,
                                        (char (*) [21])"OpFunctionParameter ");
                    pointee_type._4_4_ = Instruction::id((Instruction *)param_index);
                    pDVar6 = DiagnosticStream::operator<<(pDVar6,(uint *)((long)&pointee_type + 4));
                    pDVar6 = DiagnosticStream::operator<<
                                       (pDVar6,(char (*) [77])
                                               ": can\'t specify both Aliased and Restrict for PhysicalStorageBuffer pointer."
                                       );
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&pointee_type_id);
                    return __local._4_4_;
                  }
                }
                else {
                  OVar1 = Instruction::opcode((Instruction *)decorations);
                  if (OVar1 == OpTypePointer) {
                    pointee_type._0_4_ =
                         Instruction::GetOperandAs<unsigned_int>((Instruction *)decorations,2);
                    decorations_1 =
                         (set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                          *)ValidationState_t::FindDef
                                      ((ValidationState_t *)inst_local,(uint)pointee_type);
                    OVar1 = Instruction::opcode((Instruction *)decorations_1);
                    if ((OVar1 == OpTypePointer) &&
                       (SVar4 = Instruction::GetOperandAs<spv::StorageClass>
                                          ((Instruction *)decorations_1,1), pIVar10 = inst_local,
                       SVar4 == PhysicalStorageBuffer)) {
                      uVar2 = Instruction::id((Instruction *)param_index);
                      psStack_dd8 = ValidationState_t::id_decorations
                                              ((ValidationState_t *)pIVar10,uVar2);
                      local_de8 = (_Base_ptr)
                                  std::
                                  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                                  ::begin(psStack_dd8);
                      iStack_df0 = std::
                                   set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                                   ::end(psStack_dd8);
                      local_dd9 = std::
                                  any_of<std::_Rb_tree_const_iterator<spvtools::val::Decoration>,spvtools::val::(anonymous_namespace)::ValidateFunctionParameter(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__2>
                                            (local_de8,iStack_df0._M_node);
                      local_e00 = (_Base_ptr)
                                  std::
                                  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                                  ::begin(psStack_dd8);
                      local_e08 = (_Base_ptr)
                                  std::
                                  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                                  ::end(psStack_dd8);
                      local_df2 = std::
                                  any_of<std::_Rb_tree_const_iterator<spvtools::val::Decoration>,spvtools::val::(anonymous_namespace)::ValidateFunctionParameter(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__3>
                                            (local_e00,local_e08);
                      if (((local_dd9 & 1) == 0) && (!(bool)local_df2)) {
                        ValidationState_t::diag
                                  (&local_fe8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                                   (Instruction *)param_index);
                        pDVar6 = DiagnosticStream::operator<<
                                           (&local_fe8,(char (*) [21])"OpFunctionParameter ");
                        local_fec = Instruction::id((Instruction *)param_index);
                        pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_fec);
                        pDVar6 = DiagnosticStream::operator<<
                                           (pDVar6,(char (*) [80])
                                                                                                      
                                                  ": expected AliasedPointer or RestrictPointer for PhysicalStorageBuffer pointer."
                                           );
                        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                        DiagnosticStream::~DiagnosticStream(&local_fe8);
                        return __local._4_4_;
                      }
                      if (((local_dd9 & 1) != 0) && ((bool)local_df2)) {
                        ValidationState_t::diag
                                  (&local_11c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                                   (Instruction *)param_index);
                        pDVar6 = DiagnosticStream::operator<<
                                           (&local_11c8,(char (*) [21])"OpFunctionParameter ");
                        local_11cc = Instruction::id((Instruction *)param_index);
                        pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_11cc);
                        pDVar6 = DiagnosticStream::operator<<
                                           (pDVar6,(char (*) [91])
                                                                                                      
                                                  ": can\'t specify both AliasedPointer and RestrictPointer for PhysicalStorageBuffer pointer."
                                           );
                        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                        DiagnosticStream::~DiagnosticStream(&local_11c8);
                        return __local._4_4_;
                      }
                    }
                  }
                }
              }
              return SPV_SUCCESS;
            }
          }
          ValidationState_t::diag
                    (&local_998,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                     (Instruction *)param_index);
          pDVar6 = DiagnosticStream::operator<<
                             (&local_998,(char (*) [38])"OpFunctionParameter Result Type <id> ");
          pIVar10 = inst_local;
          uVar2 = Instruction::type_id((Instruction *)param_index);
          ValidationState_t::getIdName_abi_cxx11_
                    ((string *)local_9b8,(ValidationState_t *)pIVar10,uVar2);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_9b8);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [69])
                                     " does not match the OpTypeFunction parameter type of the same index."
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)local_9b8);
          DiagnosticStream::~DiagnosticStream(&local_998);
        }
        else {
          ValidationState_t::diag
                    (&local_7a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                     (Instruction *)param_index);
          pDVar6 = DiagnosticStream::operator<<
                             (&local_7a8,(char (*) [35])"Too many OpFunctionParameters for ");
          local_7ac = Instruction::id(local_210);
          pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_7ac);
          pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [12])": expected ");
          pvVar8 = Instruction::words(local_3f8);
          sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
          param_type = (Instruction *)(sVar9 - 3);
          pDVar6 = DiagnosticStream::operator<<(pDVar6,(unsigned_long *)&param_type);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [30])" based on the function\'s type");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          DiagnosticStream::~DiagnosticStream(&local_7a8);
        }
      }
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)local_3e8,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_LAYOUT,(Instruction *)param_index);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_3e8,
                          (char (*) [51])"Function parameter must be preceded by a function.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3e8);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateFunctionParameter(ValidationState_t& _,
                                       const Instruction* inst) {
  // NOTE: Find OpFunction & ensure OpFunctionParameter is not out of place.
  size_t param_index = 0;
  size_t inst_num = inst->LineNum() - 1;
  if (inst_num == 0) {
    return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
           << "Function parameter cannot be the first instruction.";
  }

  auto func_inst = &_.ordered_instructions()[inst_num];
  while (--inst_num) {
    func_inst = &_.ordered_instructions()[inst_num];
    if (func_inst->opcode() == spv::Op::OpFunction) {
      break;
    } else if (func_inst->opcode() == spv::Op::OpFunctionParameter) {
      ++param_index;
    }
  }

  if (func_inst->opcode() != spv::Op::OpFunction) {
    return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
           << "Function parameter must be preceded by a function.";
  }

  const auto function_type_id = func_inst->GetOperandAs<uint32_t>(3);
  const auto function_type = _.FindDef(function_type_id);
  if (!function_type) {
    return _.diag(SPV_ERROR_INVALID_ID, func_inst)
           << "Missing function type definition.";
  }
  if (param_index >= function_type->words().size() - 3) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Too many OpFunctionParameters for " << func_inst->id()
           << ": expected " << function_type->words().size() - 3
           << " based on the function's type";
  }

  const auto param_type =
      _.FindDef(function_type->GetOperandAs<uint32_t>(param_index + 2));
  if (!param_type || inst->type_id() != param_type->id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpFunctionParameter Result Type <id> "
           << _.getIdName(inst->type_id())
           << " does not match the OpTypeFunction parameter "
              "type of the same index.";
  }

  // Validate that PhysicalStorageBuffer have one of Restrict, Aliased,
  // RestrictPointer, or AliasedPointer.
  auto param_nonarray_type_id = param_type->id();
  while (_.GetIdOpcode(param_nonarray_type_id) == spv::Op::OpTypeArray) {
    param_nonarray_type_id =
        _.FindDef(param_nonarray_type_id)->GetOperandAs<uint32_t>(1u);
  }
  if (_.GetIdOpcode(param_nonarray_type_id) == spv::Op::OpTypePointer ||
      _.GetIdOpcode(param_nonarray_type_id) ==
          spv::Op::OpTypeUntypedPointerKHR) {
    auto param_nonarray_type = _.FindDef(param_nonarray_type_id);
    if (param_nonarray_type->GetOperandAs<spv::StorageClass>(1u) ==
        spv::StorageClass::PhysicalStorageBuffer) {
      // check for Aliased or Restrict
      const auto& decorations = _.id_decorations(inst->id());

      bool foundAliased = std::any_of(
          decorations.begin(), decorations.end(), [](const Decoration& d) {
            return spv::Decoration::Aliased == d.dec_type();
          });

      bool foundRestrict = std::any_of(
          decorations.begin(), decorations.end(), [](const Decoration& d) {
            return spv::Decoration::Restrict == d.dec_type();
          });

      if (!foundAliased && !foundRestrict) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "OpFunctionParameter " << inst->id()
               << ": expected Aliased or Restrict for PhysicalStorageBuffer "
                  "pointer.";
      }
      if (foundAliased && foundRestrict) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "OpFunctionParameter " << inst->id()
               << ": can't specify both Aliased and Restrict for "
                  "PhysicalStorageBuffer pointer.";
      }
    } else if (param_nonarray_type->opcode() == spv::Op::OpTypePointer) {
      const auto pointee_type_id =
          param_nonarray_type->GetOperandAs<uint32_t>(2);
      const auto pointee_type = _.FindDef(pointee_type_id);
      if (spv::Op::OpTypePointer == pointee_type->opcode() &&
          pointee_type->GetOperandAs<spv::StorageClass>(1u) ==
              spv::StorageClass::PhysicalStorageBuffer) {
        // check for AliasedPointer/RestrictPointer
        const auto& decorations = _.id_decorations(inst->id());

        bool foundAliased = std::any_of(
            decorations.begin(), decorations.end(), [](const Decoration& d) {
              return spv::Decoration::AliasedPointer == d.dec_type();
            });

        bool foundRestrict = std::any_of(
            decorations.begin(), decorations.end(), [](const Decoration& d) {
              return spv::Decoration::RestrictPointer == d.dec_type();
            });

        if (!foundAliased && !foundRestrict) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "OpFunctionParameter " << inst->id()
                 << ": expected AliasedPointer or RestrictPointer for "
                    "PhysicalStorageBuffer pointer.";
        }
        if (foundAliased && foundRestrict) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "OpFunctionParameter " << inst->id()
                 << ": can't specify both AliasedPointer and "
                    "RestrictPointer for PhysicalStorageBuffer pointer.";
        }
      }
    }
  }

  return SPV_SUCCESS;
}